

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sssort.c
# Opt level: O0

saidx_t ss_isqrt(saidx_t x)

{
  char cVar1;
  byte bVar2;
  int local_28;
  saint_t local_1c;
  int local_18;
  int local_14;
  saidx_t e;
  saidx_t y;
  saidx_t x_local;
  int local_4;
  
  if (x < 0x100000) {
    if ((x & 0xffff0000U) == 0) {
      if ((x & 0xff00U) == 0) {
        local_1c = lg_table[(int)(x & 0xff)];
      }
      else {
        local_1c = lg_table[(int)(x >> 8 & 0xff)] + 8;
      }
      local_18 = local_1c;
    }
    else {
      if ((x & 0xff000000U) == 0) {
        local_14 = lg_table[(int)(x >> 0x10 & 0xff)] + 0x10;
      }
      else {
        local_14 = lg_table[(int)(x >> 0x18 & 0xff)] + 0x18;
      }
      local_18 = local_14;
    }
    bVar2 = (byte)local_18;
    cVar1 = (char)(local_18 >> 1);
    if (local_18 < 0x10) {
      if (local_18 < 8) {
        return sqq_table[x] >> 4;
      }
      y = (sqq_table[x >> ((bVar2 - 6) - (bVar2 & 1) & 0x1f)] >> (7U - cVar1 & 0x1f)) + 1;
    }
    else {
      y = sqq_table[x >> ((bVar2 - 6) - (bVar2 & 1) & 0x1f)] << (cVar1 - 7U & 0x1f);
      if (0x17 < local_18) {
        y = y + 1 + x / y >> 1;
      }
      y = y + 1 + x / y >> 1;
    }
    if (x < y * y) {
      local_28 = y + -1;
    }
    else {
      local_28 = y;
    }
    local_4 = local_28;
  }
  else {
    local_4 = 0x400;
  }
  return local_4;
}

Assistant:

static INLINE
saidx_t
ss_isqrt(saidx_t x) {
  saidx_t y, e;

  if(x >= (SS_BLOCKSIZE * SS_BLOCKSIZE)) { return SS_BLOCKSIZE; }
  e = (x & 0xffff0000) ?
        ((x & 0xff000000) ?
          24 + lg_table[(x >> 24) & 0xff] :
          16 + lg_table[(x >> 16) & 0xff]) :
        ((x & 0x0000ff00) ?
           8 + lg_table[(x >>  8) & 0xff] :
           0 + lg_table[(x >>  0) & 0xff]);

  if(e >= 16) {
    y = sqq_table[x >> ((e - 6) - (e & 1))] << ((e >> 1) - 7);
    if(e >= 24) { y = (y + 1 + x / y) >> 1; }
    y = (y + 1 + x / y) >> 1;
  } else if(e >= 8) {
    y = (sqq_table[x >> ((e - 6) - (e & 1))] >> (7 - (e >> 1))) + 1;
  } else {
    return sqq_table[x] >> 4;
  }

  return (x < (y * y)) ? y - 1 : y;
}